

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *
Catch::Detail::parseEnums
          (vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *__return_storage_ptr__,
          StringRef enums)

{
  pointer *ppSVar1;
  ulong uVar2;
  iterator __position;
  ulong uVar3;
  ulong uVar4;
  size_type extraout_RDX;
  size_type sVar5;
  size_type extraout_RDX_00;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *__range2;
  char *pcVar6;
  Catch *this;
  char in_R8B;
  StringRef *enumValue;
  pointer pSVar7;
  StringRef ref;
  StringRef str;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> enumValues;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> local_58;
  StringRef local_40;
  
  str.m_start = (char *)enums.m_size;
  str.m_size = 0x2c;
  splitStringRef(&local_58,(Catch *)enums.m_start,str,in_R8B);
  (__return_storage_ptr__->super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::reserve
            (__return_storage_ptr__,
             (long)local_58.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_58.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4);
  if (local_58.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_58.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    sVar5 = extraout_RDX;
    pSVar7 = local_58.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      uVar2 = pSVar7->m_size;
      uVar3 = uVar2;
      do {
        uVar4 = uVar3;
        if (uVar4 == 0) break;
        uVar3 = uVar4 - 1;
      } while (pSVar7->m_start[uVar4 - 1] != ':');
      this = (Catch *)(pSVar7->m_start + uVar4);
      pcVar6 = (char *)(uVar2 - uVar4);
      if (uVar2 < uVar4) {
        pcVar6 = (char *)0x0;
      }
      if (uVar2 < uVar4 || (char *)(uVar2 - uVar4) == (char *)0x0) {
        this = (Catch *)0x167ec3;
      }
      ref.m_size = sVar5;
      ref.m_start = pcVar6;
      local_40 = trim(this,ref);
      sVar5 = local_40.m_size;
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::
        _M_realloc_insert<Catch::StringRef>(__return_storage_ptr__,__position,&local_40);
        sVar5 = extraout_RDX_00;
      }
      else {
        (__position._M_current)->m_start = local_40.m_start;
        (__position._M_current)->m_size = sVar5;
        ppSVar1 = &(__return_storage_ptr__->
                   super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      pSVar7 = pSVar7 + 1;
    } while (pSVar7 != local_58.
                       super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_58.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<StringRef> parseEnums( StringRef enums ) {
            auto enumValues = splitStringRef( enums, ',' );
            std::vector<StringRef> parsed;
            parsed.reserve( enumValues.size() );
            for( auto const& enumValue : enumValues ) {
                parsed.push_back(trim(extractInstanceName(enumValue)));
            }
            return parsed;
        }